

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall
ON_Brep::IsValidTrimTolerancesAndFlags(ON_Brep *this,int trim_index,ON_TextLog *text_log)

{
  ON_BrepTrim *pOVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(uint)trim_index;
  if (trim_index < 0 ||
      (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count <=
      trim_index) {
    if (text_log == (ON_TextLog *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count() ).\n"
                        ,uVar2);
    }
  }
  else {
    pOVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    bVar3 = pOVar1[uVar2].m_trim_index == trim_index;
    if (text_log != (ON_TextLog *)0x0 && !bVar3) {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar2);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"trim.m_trim_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[uVar2].m_trim_index,uVar2);
      ON_TextLog::PopIndent(text_log);
    }
  }
  return bVar3;
}

Assistant:

bool
ON_Brep::IsValidTrimTolerancesAndFlags( int trim_index, ON_TextLog* text_log ) const
{
  if ( trim_index < 0 || trim_index >= m_T.Count() )
  {
    if ( text_log )
      text_log->Print("brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count() ).\n",
                      trim_index, m_T.Count());
    return false;
  }
  const ON_BrepTrim& trim = m_T[trim_index];
  if ( trim.m_trim_index != trim_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_trim_index = %d (should be %d).\n",
                       trim.m_trim_index, trim_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}